

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O0

void png_warning_parameter_signed(char (*p) [32],int number,int format,png_int_32 value)

{
  png_charp pcVar1;
  char local_48 [8];
  char buffer [24];
  png_charp str;
  png_alloc_size_t u;
  png_int_32 value_local;
  int format_local;
  int number_local;
  char (*p_local) [32];
  
  str = (png_charp)(long)value;
  if (value < 0) {
    str = (png_charp)(((ulong)str ^ 0xffffffffffffffff) + 1);
  }
  pcVar1 = png_format_number(local_48,buffer + 0x10,format,(png_alloc_size_t)str);
  buffer._16_8_ = pcVar1;
  if ((value < 0) && (local_48 < pcVar1)) {
    buffer._16_8_ = pcVar1 + -1;
    pcVar1[-1] = '-';
  }
  png_warning_parameter(p,number,(png_const_charp)buffer._16_8_);
  return;
}

Assistant:

void
png_warning_parameter_signed(png_warning_parameters p, int number, int format,
    png_int_32 value)
{
   png_alloc_size_t u;
   png_charp str;
   char buffer[PNG_NUMBER_BUFFER_SIZE];

   /* Avoid overflow by doing the negate in a png_alloc_size_t: */
   u = (png_alloc_size_t)value;
   if (value < 0)
      u = ~u + 1;

   str = PNG_FORMAT_NUMBER(buffer, format, u);

   if (value < 0 && str > buffer)
      *--str = '-';

   png_warning_parameter(p, number, str);
}